

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keypoints.cpp
# Opt level: O0

bool __thiscall ary::KeypointPlaneLocalizer::add(KeypointPlaneLocalizer *this,Mat *image,float size)

{
  Mat *this_00;
  float fVar1;
  byte bVar2;
  bool bVar3;
  Feature2D *pFVar4;
  undefined8 uVar5;
  reference pKVar6;
  float fVar7;
  Size_<int> local_310;
  _OutputArray local_308;
  _InputArray local_2f0;
  int local_2d4;
  KeyPoint *local_2d0;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_2c8;
  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
  local_2c0;
  iterator it;
  float yscale;
  float xscale;
  _InputArray local_298;
  _InputArray local_280;
  _OutputArray local_268;
  MatSize local_250;
  Size size_1;
  _InputArray local_230;
  _InputArray local_218;
  undefined1 local_200 [8];
  vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> keypoints;
  Mat descriptors;
  int local_180;
  MatSize local_17c;
  Size_<float> local_174 [2];
  undefined1 local_160 [8];
  Mat tmp_image2;
  Mat tmp_image1;
  KeypointPlaneModel model;
  float size_local;
  Mat *image_local;
  KeypointPlaneLocalizer *this_local;
  
  model.size.height = size;
  KeypointPlaneModel::KeypointPlaneModel((KeypointPlaneModel *)(tmp_image1.step.buf + 1));
  this_00 = (Mat *)(tmp_image2.step.buf + 1);
  cv::Mat::Mat(this_00);
  cv::Mat::Mat((Mat *)local_160);
  cv::Mat::operator=(this_00,image);
  cv::MatSize::operator()(&local_17c);
  fVar7 = (float)(int)local_17c.p * model.size.height;
  cv::MatSize::operator()((MatSize *)((long)descriptors.step.buf + 0xc));
  cv::Size_<float>::Size_(local_174,fVar7,(float)local_180 * model.size.height);
  cv::Size_<float>::operator=((Size_<float> *)(model.descriptors.step.buf + 1),local_174);
  do {
    cv::Mat::Mat((Mat *)&keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::vector
              ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_200);
    pFVar4 = cv::Ptr<cv::Feature2D>::operator->(&this->detector);
    cv::_InputArray::_InputArray(&local_218,(Mat *)(tmp_image2.step.buf + 1));
    uVar5 = cv::noArray();
    (**(code **)(*(long *)pFVar4 + 0x40))(pFVar4,&local_218,local_200,uVar5);
    cv::_InputArray::~_InputArray(&local_218);
    pFVar4 = cv::Ptr<cv::Feature2D>::operator->(&this->detector);
    cv::_InputArray::_InputArray(&local_230,(Mat *)(tmp_image2.step.buf + 1));
    cv::_OutputArray::_OutputArray
              ((_OutputArray *)&size_1,
               (Mat *)&keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    (**(code **)(*(long *)pFVar4 + 0x50))(pFVar4,&local_230,local_200,&size_1);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&size_1);
    cv::_InputArray::~_InputArray(&local_230);
    cv::MatSize::operator()(&local_250);
    bVar2 = cv::Mat::empty();
    if ((bVar2 & 1) == 0) {
      cv::_InputArray::_InputArray
                (&local_280,
                 (Mat *)&model.keypoints.
                         super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::_InputArray
                (&local_298,
                 (Mat *)&keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::_OutputArray
                ((_OutputArray *)&yscale,
                 (Mat *)&model.keypoints.
                         super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      cv::vconcat(&local_280,&local_298,(_OutputArray *)&yscale);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&yscale);
      cv::_InputArray::~_InputArray(&local_298);
      cv::_InputArray::~_InputArray(&local_280);
    }
    else {
      cv::_OutputArray::_OutputArray
                (&local_268,
                 (Mat *)&model.keypoints.
                         super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      cv::Mat::copyTo((_OutputArray *)
                      &keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_OutputArray::~_OutputArray(&local_268);
    }
    it._M_current._4_4_ = (float)model.descriptors.step.buf[1] / (float)(int)local_250.p;
    it._M_current._0_4_ = model.descriptors.step.buf[1]._4_4_ / (float)local_250.p._4_4_;
    local_2c0._M_current =
         (KeyPoint *)
         std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::begin
                   ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_200);
    while( true ) {
      local_2c8._M_current =
           (KeyPoint *)
           std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::end
                     ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_200);
      bVar3 = __gnu_cxx::operator!=(&local_2c0,&local_2c8);
      fVar7 = it._M_current._4_4_;
      if (!bVar3) break;
      pKVar6 = __gnu_cxx::
               __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
               ::operator*(&local_2c0);
      fVar1 = it._M_current._0_4_;
      (pKVar6->pt).x = (pKVar6->pt).x * fVar7;
      pKVar6 = __gnu_cxx::
               __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
               ::operator*(&local_2c0);
      (pKVar6->pt).y = (pKVar6->pt).y * fVar1;
      pKVar6 = __gnu_cxx::
               __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
               ::operator*(&local_2c0);
      std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)(tmp_image1.step.buf + 1),
                 pKVar6);
      local_2d0 = (KeyPoint *)
                  __gnu_cxx::
                  __normal_iterator<cv::KeyPoint_*,_std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>_>
                  ::operator++(&local_2c0,0);
    }
    if (this->type == AKAZE) {
      local_2d4 = 3;
    }
    else if ((int)local_250.p * local_250.p._4_4_ < 30000) {
      local_2d4 = 3;
    }
    else {
      cv::_InputArray::_InputArray(&local_2f0,(Mat *)(tmp_image2.step.buf + 1));
      cv::_OutputArray::_OutputArray(&local_308,(Mat *)local_160);
      cv::Size_<int>::Size_(&local_310);
      cv::pyrDown(&local_2f0,&local_308,(Size_ *)&local_310,4);
      cv::_OutputArray::~_OutputArray(&local_308);
      cv::_InputArray::~_InputArray(&local_2f0);
      cv::Mat::operator=((Mat *)(tmp_image2.step.buf + 1),(Mat *)local_160);
      local_2d4 = 0;
    }
    std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::~vector
              ((vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *)local_200);
    cv::Mat::~Mat((Mat *)&keypoints.super__Vector_base<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  } while (local_2d4 == 0);
  std::vector<ary::KeypointPlaneModel,_std::allocator<ary::KeypointPlaneModel>_>::push_back
            (&this->models,(value_type *)(tmp_image1.step.buf + 1));
  local_2d4 = 1;
  cv::Mat::~Mat((Mat *)local_160);
  cv::Mat::~Mat((Mat *)(tmp_image2.step.buf + 1));
  KeypointPlaneModel::~KeypointPlaneModel((KeypointPlaneModel *)(tmp_image1.step.buf + 1));
  return true;
}

Assistant:

bool KeypointPlaneLocalizer::add(const Mat& image, float size) {

	KeypointPlaneModel model;

	Mat tmp_image1, tmp_image2;
	tmp_image1 = image;

	model.size = Size2f(tmp_image1.size().width * size, tmp_image1.size().height * size);

	while (true) {
		Mat descriptors;
		vector<KeyPoint> keypoints;

		detector->detect(tmp_image1, keypoints);
		detector->compute(tmp_image1, keypoints, descriptors);
		//descriptors.convertTo(descriptors, CV_32F);

		Size size = tmp_image1.size();
		if (model.descriptors.empty()) {
			descriptors.copyTo(model.descriptors);
		} else {
			vconcat(model.descriptors, descriptors, model.descriptors);
		}

		float xscale = (float) model.size.width / (float) size.width;
		float yscale = (float) model.size.height / (float) size.height;

		for (vector<KeyPoint>::iterator it = keypoints.begin(); it != keypoints.end(); it++) {
			(*it).pt.x *= xscale;
			(*it).pt.y *= yscale;
			model.keypoints.push_back(*it);
		}

		if (type == AKAZE) break; // No need for additional features.

		if (size.width * size.height < 30000) break;

		pyrDown(tmp_image1, tmp_image2, Size());
		tmp_image1 = tmp_image2;
	}

	models.push_back(model);

	return true;
}